

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,position_t *pos,string *what_arg)

{
  size_t byte_;
  char *what_arg_00;
  position_t *pos_00;
  string local_120;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string w;
  string *what_arg_local;
  position_t *pos_local;
  int id__local;
  
  w.field_2._8_8_ = what_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"parse_error",&local_e9);
  exception::name(&local_c8,&local_e8,id_);
  std::operator+(&local_a8,&local_c8,"parse error");
  position_string_abi_cxx11_(&local_120,(parse_error *)pos,pos_00);
  std::operator+(&local_88,&local_a8,&local_120);
  std::operator+(&local_68,&local_88,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 w.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  byte_ = pos->chars_read_total;
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  parse_error(__return_storage_ptr__,id_,byte_,what_arg_00);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg)
{
std::string w = exception::name("parse_error", id_) + "parse error" +
position_string(pos) + ": " + what_arg;
return parse_error(id_, pos.chars_read_total, w.c_str());
}